

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportCommand.cxx
# Opt level: O0

void __thiscall
cmExportCommand::StorePackageRegistryDir
          (cmExportCommand *this,string *package,char *content,char *hash)

{
  cmMakefile *this_00;
  bool bVar1;
  ostream *poVar2;
  string local_458;
  string local_438 [32];
  undefined1 local_418 [8];
  ostringstream e;
  undefined1 local_2a0 [8];
  cmGeneratedFileStream entry;
  undefined1 local_48 [8];
  string fname;
  char *hash_local;
  char *content_local;
  string *package_local;
  cmExportCommand *this_local;
  
  fname.field_2._8_8_ = hash;
  std::__cxx11::string::string((string *)local_48);
  bVar1 = cmsys::SystemTools::GetEnv("HOME",(string *)local_48);
  if (bVar1) {
    cmsys::SystemTools::ConvertToUnixSlashes((string *)local_48);
    std::__cxx11::string::operator+=((string *)local_48,"/.cmake/packages/");
    std::__cxx11::string::operator+=((string *)local_48,(string *)package);
    cmsys::SystemTools::MakeDirectory((string *)local_48,(mode_t *)0x0);
    std::__cxx11::string::operator+=((string *)local_48,"/");
    std::__cxx11::string::operator+=((string *)local_48,(char *)fname.field_2._8_8_);
    bVar1 = cmsys::SystemTools::FileExists((string *)local_48);
    if (!bVar1) {
      cmGeneratedFileStream::cmGeneratedFileStream
                ((cmGeneratedFileStream *)local_2a0,(string *)local_48,true,None);
      bVar1 = std::ios::operator_cast_to_bool
                        ((ios *)(local_2a0 + (long)*(_func_int **)((long)local_2a0 + -0x18)));
      if (bVar1) {
        poVar2 = std::operator<<((ostream *)local_2a0,content);
        std::operator<<(poVar2,"\n");
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_418);
        poVar2 = std::operator<<((ostream *)local_418,"Cannot create package registry file:\n");
        poVar2 = std::operator<<(poVar2,"  ");
        poVar2 = std::operator<<(poVar2,(string *)local_48);
        poVar2 = std::operator<<(poVar2,"\n");
        cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
        poVar2 = std::operator<<(poVar2,local_438);
        std::operator<<(poVar2,"\n");
        std::__cxx11::string::~string(local_438);
        this_00 = (this->super_cmCommand).Makefile;
        std::__cxx11::ostringstream::str();
        cmMakefile::IssueMessage(this_00,WARNING,&local_458);
        std::__cxx11::string::~string((string *)&local_458);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_418);
      }
      cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_2a0);
    }
    entry._576_4_ = 0;
  }
  else {
    entry._576_4_ = 1;
  }
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void cmExportCommand::StorePackageRegistryDir(std::string const& package,
                                              const char* content,
                                              const char* hash)
{
#  if defined(__HAIKU__)
  char dir[B_PATH_NAME_LENGTH];
  if (find_directory(B_USER_SETTINGS_DIRECTORY, -1, false, dir, sizeof(dir)) !=
      B_OK) {
    return;
  }
  std::string fname = dir;
  fname += "/cmake/packages/";
  fname += package;
#  else
  std::string fname;
  if (!cmSystemTools::GetEnv("HOME", fname)) {
    return;
  }
  cmSystemTools::ConvertToUnixSlashes(fname);
  fname += "/.cmake/packages/";
  fname += package;
#  endif
  cmSystemTools::MakeDirectory(fname);
  fname += "/";
  fname += hash;
  if (!cmSystemTools::FileExists(fname)) {
    cmGeneratedFileStream entry(fname, true);
    if (entry) {
      entry << content << "\n";
    } else {
      std::ostringstream e;
      /* clang-format off */
      e << "Cannot create package registry file:\n"
        << "  " << fname << "\n"
        << cmSystemTools::GetLastSystemError() << "\n";
      /* clang-format on */
      this->Makefile->IssueMessage(MessageType::WARNING, e.str());
    }
  }
}